

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O0

void __thiscall
myvk::SemaphoreGroup::Initialize
          (SemaphoreGroup *this,
          vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
          *semaphores)

{
  bool bVar1;
  element_type *this_00;
  undefined8 in_RSI;
  vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_> *in_RDI;
  shared_ptr<myvk::Semaphore> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
  *__range1;
  vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::shared_ptr<myvk::Semaphore>_*,_std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>_>
  local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::clear
            ((vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_> *)0x2cb90d);
  local_18 = local_10;
  local_20._M_current =
       (shared_ptr<myvk::Semaphore> *)
       std::
       vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::shared_ptr<myvk::Semaphore>_*,_std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>_>
                      ((__normal_iterator<const_std::shared_ptr<myvk::Semaphore>_*,_std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::shared_ptr<myvk::Semaphore>_*,_std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<myvk::Semaphore>_*,_std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>_>
    ::operator*(&local_20);
    this_00 = std::__shared_ptr_access<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2cb965);
    Semaphore::GetHandle(this_00);
    std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
              (in_RDI,(value_type *)in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<myvk::Semaphore>_*,_std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void SemaphoreGroup::Initialize(const std::vector<Ptr<Semaphore>> &semaphores) {
	m_semaphores.clear();
	for (const auto &i : semaphores)
		m_semaphores.push_back(i->GetHandle());
}